

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O0

URL * __thiscall
miniros::master::AddressResolver::resolveAddressFor
          (AddressResolver *this,shared_ptr<miniros::master::NodeRef> *node,
          shared_ptr<miniros::master::NodeRef> *requester)

{
  Level LVar1;
  bool bVar2;
  element_type *peVar3;
  undefined8 uVar4;
  element_type *peVar5;
  string *psVar6;
  __shared_ptr *in_RCX;
  __shared_ptr *in_RDX;
  long in_RSI;
  URL *in_RDI;
  bool enabled_5;
  bool enabled_4;
  NetAddress *addr;
  iterator __end3_1;
  iterator __begin3_1;
  set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
  *__range3_1;
  bool enabled_3;
  NetAdapter *adapter;
  const_iterator __end3;
  const_iterator __begin3;
  vector<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_> *__range3;
  bool enabled_2;
  shared_ptr<const_miniros::master::HostInfo> requesterHost;
  bool enabled_1;
  shared_ptr<const_miniros::master::HostInfo> nodeHost;
  scoped_lock<std::mutex> lock;
  bool enabled;
  URL *url;
  NodeRef *in_stack_fffffffffffffb18;
  URL *in_stack_fffffffffffffb20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb28;
  LogLocation *in_stack_fffffffffffffb30;
  HostInfo *in_stack_fffffffffffffb40;
  Level LVar8;
  void *pvVar7;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  Level LVar9;
  LogLocation *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 local_369 [33];
  string local_348 [16];
  NetAddress *in_stack_fffffffffffffcc8;
  allocator<char> local_301;
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  reference local_280;
  _Self local_278;
  _Self local_270;
  set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
  *local_268;
  undefined1 local_25a;
  allocator<char> local_259;
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  reference local_1d8;
  NetAdapter *local_1d0;
  __normal_iterator<const_miniros::master::NetAdapter_*,_std::vector<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>_>
  local_1c8;
  long local_1c0;
  undefined1 local_1b2;
  allocator<char> local_1b1;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [48];
  __shared_ptr local_140 [22];
  undefined1 local_12a;
  allocator<char> local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [48];
  __shared_ptr local_b8 [24];
  undefined4 local_a0;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98 [32];
  string local_78 [32];
  string local_58 [55];
  byte local_21;
  __shared_ptr *local_20;
  
  local_20 = in_RCX;
  bVar2 = ::std::__shared_ptr::operator_cast_to_bool(in_RDX);
  if (bVar2) {
    local_21 = 0;
    ::std::__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x54a4a2);
    NodeRef::getUrl(in_stack_fffffffffffffb18);
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool(local_20);
    if (bVar2) {
      ::std::scoped_lock<std::mutex>::scoped_lock
                ((scoped_lock<std::mutex> *)in_stack_fffffffffffffb20,
                 (mutex_type *)in_stack_fffffffffffffb18);
      if ((*(byte *)(in_RSI + 0x68) & 1) == 0) {
        local_21 = 1;
        local_a0 = 1;
      }
      else {
        ::std::
        __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x54a7c2);
        NodeRef::hostInfo(in_stack_fffffffffffffb18);
        ::std::weak_ptr<const_miniros::master::HostInfo>::lock
                  ((weak_ptr<const_miniros::master::HostInfo> *)in_stack_fffffffffffffb28);
        ::std::weak_ptr<const_miniros::master::HostInfo>::~weak_ptr
                  ((weak_ptr<const_miniros::master::HostInfo> *)0x54a7f6);
        bVar2 = ::std::__shared_ptr::operator_cast_to_bool(local_b8);
        if (bVar2) {
          ::std::
          __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x54aade);
          NodeRef::hostInfo(in_stack_fffffffffffffb18);
          ::std::weak_ptr<const_miniros::master::HostInfo>::lock
                    ((weak_ptr<const_miniros::master::HostInfo> *)in_stack_fffffffffffffb28);
          ::std::weak_ptr<const_miniros::master::HostInfo>::~weak_ptr
                    ((weak_ptr<const_miniros::master::HostInfo> *)0x54ab12);
          bVar2 = ::std::__shared_ptr::operator_cast_to_bool(local_140);
          if (bVar2) {
            bVar2 = ::std::__shared_ptr::operator_cast_to_bool(local_140);
            if ((!bVar2) ||
               (bVar2 = ::std::operator==((shared_ptr<const_miniros::master::HostInfo> *)
                                          in_stack_fffffffffffffb20,
                                          (shared_ptr<const_miniros::master::HostInfo> *)
                                          in_stack_fffffffffffffb18), !bVar2)) {
              peVar5 = ::std::
                       __shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x54ae67);
              if ((peVar5->local & 1U) == 0) {
                peVar5 = ::std::
                         __shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x54b25c);
                local_268 = &peVar5->addresses;
                local_270._M_node =
                     (_Base_ptr)
                     ::std::
                     set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
                     ::begin((set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
                              *)in_stack_fffffffffffffb18);
                local_278._M_node =
                     (_Base_ptr)
                     ::std::
                     set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
                     ::end((set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
                            *)in_stack_fffffffffffffb18);
                while( true ) {
                  bVar2 = ::std::operator!=(&local_270,&local_278);
                  LVar8 = (Level)((ulong)in_stack_fffffffffffffb40 >> 0x20);
                  LVar9 = (Level)((ulong)in_stack_fffffffffffffb18 >> 0x20);
                  if (!bVar2) break;
                  local_280 = ::std::_Rb_tree_const_iterator<miniros::network::NetAddress>::
                              operator*((_Rb_tree_const_iterator<miniros::network::NetAddress> *)
                                        in_stack_fffffffffffffb20);
                  bVar2 = network::NetAddress::isLocal((NetAddress *)in_stack_fffffffffffffb20);
                  if (!bVar2) {
                    network::NetAddress::str_abi_cxx11_(in_stack_fffffffffffffcc8);
                    ::std::__cxx11::string::operator=((string *)in_RDI,local_2a0);
                    ::std::__cxx11::string::~string(local_2a0);
                    goto LAB_0054b886;
                  }
                  ::std::_Rb_tree_const_iterator<miniros::network::NetAddress>::operator++
                            ((_Rb_tree_const_iterator<miniros::network::NetAddress> *)
                             in_stack_fffffffffffffb20);
                }
                if (((console::g_initialized ^ 0xff) & 1) != 0) {
                  console::initialize();
                }
                if (((resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                      ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffffb60,
                             (char *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                             (allocator<char> *)in_stack_fffffffffffffb50);
                  ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
                  ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
                  console::initializeLogLocation
                            (in_stack_fffffffffffffb50,
                             (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)
                             ,LVar8);
                  ::std::__cxx11::string::~string(local_2c0);
                  ::std::__cxx11::string::~string(local_2e0);
                  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffd00);
                  ::std::allocator<char>::~allocator(&local_301);
                }
                if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                    ::loc.level_ != Warn) {
                  console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffb20,LVar9);
                  console::checkLogLocationEnabled(in_stack_fffffffffffffb30);
                }
                pvVar7 = resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                         ::loc.logger_;
                LVar1 = resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                        ::loc.level_;
                if ((resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                     ::loc.logger_enabled_ & 1U) != 0) {
                  peVar3 = ::std::
                           __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x54b553);
                  NodeRef::id_abi_cxx11_(peVar3);
                  in_stack_fffffffffffffb20 = (URL *)::std::__cxx11::string::c_str();
                  peVar3 = ::std::
                           __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x54b57e);
                  NodeRef::id_abi_cxx11_(peVar3);
                  in_stack_fffffffffffffb28 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ::std::__cxx11::string::c_str();
                  LVar9 = Debug;
                  console::print((FilterBase *)0x0,pvVar7,(Level)(ulong)LVar1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                                 ,0xe7,
                                 "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                                );
                }
              }
              else {
                local_1c0 = in_RSI + 0x20;
                local_1c8._M_current =
                     (NetAdapter *)
                     ::std::
                     vector<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>
                     ::begin((vector<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>
                              *)in_stack_fffffffffffffb18);
                local_1d0 = (NetAdapter *)
                            ::std::
                            vector<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>
                            ::end((vector<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>
                                   *)in_stack_fffffffffffffb18);
                while (bVar2 = __gnu_cxx::operator!=
                                         ((__normal_iterator<const_miniros::master::NetAdapter_*,_std::vector<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>_>
                                           *)in_stack_fffffffffffffb20,
                                          (__normal_iterator<const_miniros::master::NetAdapter_*,_std::vector<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>_>
                                           *)in_stack_fffffffffffffb18), bVar2) {
                  local_1d8 = __gnu_cxx::
                              __normal_iterator<const_miniros::master::NetAdapter_*,_std::vector<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>_>
                              ::operator*(&local_1c8);
                  ::std::
                  __shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)in_stack_fffffffffffffb20);
                  bVar2 = NetAdapter::hasAccessTo
                                    ((NetAdapter *)
                                     CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                                     in_stack_fffffffffffffb40);
                  if (bVar2) {
                    network::NetAddress::str_abi_cxx11_(in_stack_fffffffffffffcc8);
                    ::std::__cxx11::string::operator=((string *)in_RDI,local_1f8);
                    ::std::__cxx11::string::~string(local_1f8);
                    goto LAB_0054b886;
                  }
                  __gnu_cxx::
                  __normal_iterator<const_miniros::master::NetAdapter_*,_std::vector<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>_>
                  ::operator++(&local_1c8);
                }
                if (((console::g_initialized ^ 0xff) & 1) != 0) {
                  console::initialize();
                }
                LVar8 = (Level)((ulong)in_stack_fffffffffffffb40 >> 0x20);
                LVar9 = (Level)((ulong)in_stack_fffffffffffffb18 >> 0x20);
                if (((resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                      ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffffb60,
                             (char *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                             (allocator<char> *)in_stack_fffffffffffffb50);
                  ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
                  ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
                  console::initializeLogLocation
                            (in_stack_fffffffffffffb50,
                             (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)
                             ,LVar8);
                  ::std::__cxx11::string::~string(local_218);
                  ::std::__cxx11::string::~string(local_238);
                  ::std::__cxx11::string::~string(local_258);
                  ::std::allocator<char>::~allocator(&local_259);
                }
                if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                    ::loc.level_ != Warn) {
                  console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffb20,LVar9);
                  console::checkLogLocationEnabled(in_stack_fffffffffffffb30);
                }
                pvVar7 = resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                         ::loc.logger_;
                LVar1 = resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                        ::loc.level_;
                local_25a = (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                             ::loc.logger_enabled_ & 1U) != 0;
                if ((bool)local_25a) {
                  peVar3 = ::std::
                           __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x54b1a3);
                  NodeRef::id_abi_cxx11_(peVar3);
                  in_stack_fffffffffffffb20 = (URL *)::std::__cxx11::string::c_str();
                  peVar3 = ::std::
                           __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x54b1d7);
                  NodeRef::id_abi_cxx11_(peVar3);
                  in_stack_fffffffffffffb28 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ::std::__cxx11::string::c_str();
                  LVar9 = Debug;
                  console::print((FilterBase *)0x0,pvVar7,(Level)(ulong)LVar1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                                 ,0xde,
                                 "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                                );
                }
              }
              if (((console::g_initialized ^ 0xff) & 1) != 0) {
                console::initialize();
              }
              if (((resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                    ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_369;
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string<std::allocator<char>>
                          (this_00,(char *)CONCAT17(in_stack_fffffffffffffb5f,
                                                    in_stack_fffffffffffffb58),
                           (allocator<char> *)in_stack_fffffffffffffb50);
                ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
                ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
                console::initializeLogLocation
                          (in_stack_fffffffffffffb50,
                           (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                           LVar8);
                ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffcd8);
                ::std::__cxx11::string::~string(local_348);
                ::std::__cxx11::string::~string((string *)(local_369 + 1));
                ::std::allocator<char>::~allocator((allocator<char> *)local_369);
              }
              if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                  ::loc.level_ != Warn) {
                console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffb20,LVar9);
                console::checkLogLocationEnabled(in_stack_fffffffffffffb30);
              }
              if ((resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                   ::loc.logger_enabled_ & 1U) != 0) {
                pvVar7 = resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                         ::loc.logger_;
                LVar9 = resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                        ::loc.level_;
                peVar3 = ::std::
                         __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x54b7e4);
                NodeRef::id_abi_cxx11_(peVar3);
                in_stack_fffffffffffffb20 = (URL *)::std::__cxx11::string::c_str();
                peVar3 = ::std::
                         __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x54b80f);
                psVar6 = NodeRef::id_abi_cxx11_(peVar3);
                uVar4 = ::std::__cxx11::string::c_str();
                console::print((FilterBase *)0x0,pvVar7,(Level)(ulong)LVar9,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                               ,0xea,
                               "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                               ,"resolveAddressFor(%s) - failed to resolve address for %s",
                               in_stack_fffffffffffffb20,uVar4,in_stack_fffffffffffffb20,psVar6);
              }
            }
          }
          else {
            if (((console::g_initialized ^ 0xff) & 1) != 0) {
              console::initialize();
            }
            LVar8 = (Level)((ulong)in_stack_fffffffffffffb40 >> 0x20);
            LVar9 = (Level)((ulong)in_stack_fffffffffffffb18 >> 0x20);
            if (((resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                  ::loc.initialized_ ^ 0xffU) & 1) != 0) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffb60,
                         (char *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                         (allocator<char> *)in_stack_fffffffffffffb50);
              ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
              ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
              console::initializeLogLocation
                        (in_stack_fffffffffffffb50,
                         (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                         LVar8);
              ::std::__cxx11::string::~string(local_170);
              ::std::__cxx11::string::~string(local_190);
              ::std::__cxx11::string::~string(local_1b0);
              ::std::allocator<char>::~allocator(&local_1b1);
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.level_ != Warn) {
              console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffb20,LVar9);
              console::checkLogLocationEnabled(in_stack_fffffffffffffb30);
            }
            pvVar7 = resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                     ::loc.logger_;
            LVar9 = resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                    ::loc.level_;
            local_1b2 = (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                         ::loc.logger_enabled_ & 1U) != 0;
            if ((bool)local_1b2) {
              peVar3 = ::std::
                       __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x54ad55);
              NodeRef::id_abi_cxx11_(peVar3);
              in_stack_fffffffffffffb20 = (URL *)::std::__cxx11::string::c_str();
              peVar3 = ::std::
                       __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x54ad89);
              NodeRef::id_abi_cxx11_(peVar3);
              uVar4 = ::std::__cxx11::string::c_str();
              console::print((FilterBase *)0x0,pvVar7,(Level)(ulong)LVar9,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                             ,0xce,
                             "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                             ,"resolveAddressFor(%s) - no HostInfo for requester %s",
                             in_stack_fffffffffffffb20,uVar4);
            }
          }
LAB_0054b886:
          local_21 = 1;
          local_a0 = 1;
          ::std::shared_ptr<const_miniros::master::HostInfo>::~shared_ptr
                    ((shared_ptr<const_miniros::master::HostInfo> *)0x54b893);
        }
        else {
          if (((console::g_initialized ^ 0xff) & 1) != 0) {
            console::initialize();
          }
          LVar8 = (Level)((ulong)in_stack_fffffffffffffb40 >> 0x20);
          LVar9 = (Level)((ulong)in_stack_fffffffffffffb18 >> 0x20);
          if (((resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.initialized_ ^ 0xffU) & 1) != 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffb60,
                       (char *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                       (allocator<char> *)in_stack_fffffffffffffb50);
            ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
            ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
            console::initializeLogLocation
                      (in_stack_fffffffffffffb50,
                       (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),LVar8
                      );
            ::std::__cxx11::string::~string(local_e8);
            ::std::__cxx11::string::~string(local_108);
            ::std::__cxx11::string::~string(local_128);
            ::std::allocator<char>::~allocator(&local_129);
          }
          if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
              ::loc.level_ != Warn) {
            console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffb20,LVar9);
            console::checkLogLocationEnabled(in_stack_fffffffffffffb30);
          }
          pvVar7 = resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                   ::loc.logger_;
          LVar9 = resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                  ::loc.level_;
          local_12a = (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                       ::loc.logger_enabled_ & 1U) != 0;
          if ((bool)local_12a) {
            peVar3 = ::std::
                     __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x54aa52);
            NodeRef::id_abi_cxx11_(peVar3);
            in_stack_fffffffffffffb20 = (URL *)::std::__cxx11::string::c_str();
            console::print((FilterBase *)0x0,pvVar7,(Level)(ulong)LVar9,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                           ,200,
                           "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                           ,"resolveAddressFor(%s) - no HostInfo");
          }
          local_21 = 1;
          local_a0 = 1;
        }
        ::std::shared_ptr<const_miniros::master::HostInfo>::~shared_ptr
                  ((shared_ptr<const_miniros::master::HostInfo> *)0x54b8b1);
      }
      ::std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x54b8cf);
    }
    else {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      LVar8 = (Level)((ulong)in_stack_fffffffffffffb40 >> 0x20);
      LVar9 = (Level)((ulong)in_stack_fffffffffffffb18 >> 0x20);
      if (((resolveAddressFor::loc.initialized_ ^ 0xffU) & 1) != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb60,
                   (char *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                   (allocator<char> *)in_stack_fffffffffffffb50);
        ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
        ::std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
        console::initializeLogLocation
                  (in_stack_fffffffffffffb50,
                   (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),LVar8);
        ::std::__cxx11::string::~string(local_58);
        ::std::__cxx11::string::~string(local_78);
        ::std::__cxx11::string::~string(local_98);
        ::std::allocator<char>::~allocator(&local_99);
      }
      if (resolveAddressFor::loc.level_ != Warn) {
        console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffb20,LVar9);
        console::checkLogLocationEnabled(in_stack_fffffffffffffb30);
      }
      pvVar7 = resolveAddressFor::loc.logger_;
      LVar9 = resolveAddressFor::loc.level_;
      local_9a = (resolveAddressFor::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_9a) {
        peVar3 = ::std::
                 __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x54a6f5);
        NodeRef::id_abi_cxx11_(peVar3);
        in_stack_fffffffffffffb20 = (URL *)::std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,pvVar7,(Level)(ulong)LVar9,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                       ,0xbe,
                       "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                       ,"resolveAddressFor(%s) - requester is null");
      }
      local_21 = 1;
      local_a0 = 1;
    }
    if ((local_21 & 1) == 0) {
      network::URL::~URL(in_stack_fffffffffffffb20);
    }
  }
  else {
    network::URL::URL(in_stack_fffffffffffffb20);
  }
  return in_RDI;
}

Assistant:

network::URL AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef>& node, const std::shared_ptr<NodeRef>& requester) const
{
  assert(node);
  if (!node)
    return {};
  network::URL url = node->getUrl();

  assert(requester);
  if (!requester) {
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - requester is null", node->id().c_str());
    return url;
  }

  std::scoped_lock lock(m_mutex);
  if (!m_resolveIp)
    return url;

  auto nodeHost = node->hostInfo().lock();
  if (!nodeHost) {
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no HostInfo", node->id().c_str());
    return url;
  }

  auto requesterHost = requester->hostInfo().lock();
  if (!requesterHost) {
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no HostInfo for requester %s", node->id().c_str(), requester->id().c_str());
    return url;
  }

  if (requesterHost && nodeHost == requesterHost) {
    // Both requester and node are on the same host. No additional resolution is needed.
    return url;
  }

  if (nodeHost->local) {
    for (const auto& adapter: m_adapters) {
      if (adapter.hasAccessTo(*requesterHost)) {
        url.host = adapter.address.str();
        return url;
      }
    }
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no adapter matched for %s", node->id().c_str(), requester->id().c_str());
  } else {
    // Just return any address. That will fork for simple networks.
    for (const auto& addr: nodeHost->addresses) {
      if (!addr.isLocal()) {
        url.host = addr.str();
        return url;
      }
    }
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no suitable host address found for node %s", node->id().c_str(), requester->id().c_str());
  }

  MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - failed to resolve address for %s", node->id().c_str(), requester->id().c_str());
  return url;
}